

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool MomentChi2Test(HashInfo *info,int inputSize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pfHash p_Var3;
  undefined1 auVar4 [16];
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint i;
  uint uVar12;
  ulong uVar13;
  uint *__s;
  longdouble lVar14;
  longdouble lVar15;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  longdouble lVar21;
  longdouble lVar22;
  longdouble lVar23;
  longdouble lVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 uStack_1a0;
  longdouble lStack_198;
  undefined8 uStack_180;
  ulong uStack_178;
  char hbuff [64];
  longdouble local_88;
  longdouble local_60;
  longdouble local_50;
  
  iVar6 = info->hashbits;
  p_Var3 = info->hash;
  uVar12 = ((byte)~g_testExtra & 1) * 3 + 3;
  uVar10 = 3;
  if (0x80 < iVar6) {
    uVar10 = uVar12;
  }
  if (500.0 < g_speed) {
    uVar10 = uVar12;
  }
  lVar5 = -((ulong)(uint)inputSize + 0xf & 0xfffffffffffffff0);
  __s = (uint *)(hbuff + lVar5 + -8);
  *(undefined8 *)((long)&uStack_180 + lVar5) = 0x1084d6;
  memset(__s,0,(ulong)(uint)inputSize);
  uStack_178 = 0;
  hbuff[0] = '\0';
  hbuff[1] = '\0';
  hbuff[2] = '\0';
  hbuff[3] = '\0';
  hbuff[4] = '\0';
  hbuff[5] = '\0';
  hbuff[6] = '\0';
  hbuff[7] = '\0';
  hbuff[8] = '\0';
  hbuff[9] = '\0';
  hbuff[10] = '\0';
  hbuff[0xb] = '\0';
  hbuff[0xc] = '\0';
  hbuff[0xd] = '\0';
  hbuff[0xe] = '\0';
  hbuff[0xf] = '\0';
  hbuff[0x10] = '\0';
  hbuff[0x11] = '\0';
  hbuff[0x12] = '\0';
  hbuff[0x13] = '\0';
  hbuff[0x14] = '\0';
  hbuff[0x15] = '\0';
  hbuff[0x16] = '\0';
  hbuff[0x17] = '\0';
  hbuff[0x18] = '\0';
  hbuff[0x19] = '\0';
  hbuff[0x1a] = '\0';
  hbuff[0x1b] = '\0';
  hbuff[0x1c] = '\0';
  hbuff[0x1d] = '\0';
  hbuff[0x1e] = '\0';
  hbuff[0x1f] = '\0';
  hbuff[0x20] = '\0';
  hbuff[0x21] = '\0';
  hbuff[0x22] = '\0';
  hbuff[0x23] = '\0';
  hbuff[0x24] = '\0';
  hbuff[0x25] = '\0';
  hbuff[0x26] = '\0';
  hbuff[0x27] = '\0';
  hbuff[0x28] = '\0';
  hbuff[0x29] = '\0';
  hbuff[0x2a] = '\0';
  hbuff[0x2b] = '\0';
  hbuff[0x2c] = '\0';
  hbuff[0x2d] = '\0';
  hbuff[0x2e] = '\0';
  hbuff[0x2f] = '\0';
  hbuff[0x30] = '\0';
  hbuff[0x31] = '\0';
  hbuff[0x32] = '\0';
  hbuff[0x33] = '\0';
  hbuff[0x34] = '\0';
  hbuff[0x35] = '\0';
  hbuff[0x36] = '\0';
  hbuff[0x37] = '\0';
  *(undefined8 *)((long)&uStack_180 + lVar5) = 0x108504;
  printf("Analyze hashes produced from a serie of linearly increasing numbers of %i-bit, using a step of %d ... \n"
         ,(ulong)(uint)(inputSize * 8),(ulong)uVar10);
  *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10850b;
  fflush((FILE *)0x0);
  lVar14 = (longdouble)3.89182e+07;
  lVar15 = (longdouble)410450.0;
  iVar11 = 0x40;
  if (iVar6 < 0x40) {
    iVar11 = iVar6;
  }
  iVar6 = iVar11 + 7;
  if (-1 < iVar11) {
    iVar6 = iVar11;
  }
  if (iVar6 >> 3 != 8) {
    if (iVar6 >> 3 != 4) {
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x1089f5;
      puts("hash size not covered ");
      *(code **)((long)&uStack_180 + lVar5) = testHash;
      abort();
    }
    lVar14 = (longdouble)1.39129e+06;
    lVar15 = (longdouble)1030.9;
  }
  *(longdouble *)(&stack0xfffffffffffffe78 + lVar5) = lVar15;
  *(longdouble *)((long)&lStack_198 + lVar5) = lVar14;
  *(undefined8 *)((long)&uStack_1a0 + lVar5) = 0x108584;
  printf("Target values to approximate : %Lf - %Lf \n");
  uVar12 = 1;
  lVar21 = (longdouble)0;
  uVar13 = 0;
  lVar20 = lVar21;
  lVar22 = lVar21;
  lVar24 = lVar21;
  lVar23 = lVar21;
  local_88 = lVar21;
  local_60 = lVar21;
  local_50 = lVar21;
  do {
    *__s = uVar12;
    *(undefined8 *)((long)&uStack_180 + lVar5) = 0x1085ed;
    (*p_Var3)(__s,inputSize,0,&uStack_178);
    lVar8 = POPCOUNT(uStack_178);
    lVar7 = iVar11 - lVar8;
    lVar8 = lVar8 * lVar8 * lVar8 * lVar8 * lVar8;
    lVar7 = lVar7 * lVar7 * lVar7 * lVar7 * lVar7;
    lVar23 = (longdouble)lVar8 + lVar23;
    local_50 = local_50 + (longdouble)(lVar8 * lVar8);
    lVar22 = (longdouble)lVar7 + (longdouble)*(float *)(&DAT_0019d258 + (ulong)(lVar7 < 0) * 4) +
             lVar22;
    lVar9 = POPCOUNT(uVar13 ^ uStack_178);
    lVar8 = iVar11 - lVar9;
    lVar9 = lVar9 * lVar9 * lVar9 * lVar9 * lVar9;
    local_60 = local_60 +
               (longdouble)(lVar7 * lVar7) +
               (longdouble)*(float *)(&DAT_0019d258 + (ulong)(lVar7 * lVar7 < 0) * 4);
    lVar24 = (longdouble)lVar9 + lVar24;
    lVar7 = lVar8 * lVar8 * lVar8 * lVar8 * lVar8;
    local_88 = local_88 + (longdouble)(lVar9 * lVar9);
    lVar20 = (longdouble)lVar7 + (longdouble)*(float *)(&DAT_0019d258 + (ulong)(lVar7 < 0) * 4) +
             lVar20;
    lVar21 = (longdouble)(lVar7 * lVar7) +
             (longdouble)*(float *)(&DAT_0019d258 + (ulong)(lVar7 * lVar7 < 0) * 4) + lVar21;
    uVar12 = uVar12 + uVar10;
    uVar13 = uStack_178;
  } while (uVar12 < 0xfffffff1);
  lVar16 = (longdouble)(int)(0xfffffff0 / (ulong)uVar10);
  lVar23 = lVar23 / lVar16;
  lVar24 = lVar24 / lVar16;
  lVar22 = lVar22 / lVar16;
  lVar20 = lVar20 / lVar16;
  lVar17 = (local_50 / lVar16 - lVar23 * lVar23) / lVar16;
  lVar18 = (local_88 / lVar16 - lVar24 * lVar24) / lVar16;
  lVar19 = (local_60 / lVar16 - lVar22 * lVar22) / lVar16;
  lVar16 = (lVar21 / lVar16 - lVar20 * lVar20) / lVar16;
  *(longdouble *)((long)&lStack_198 + lVar5) = lVar23;
  *(longdouble *)(&stack0xfffffffffffffe78 + lVar5) = lVar17;
  *(undefined8 *)((long)&uStack_1a0 + lVar5) = 0x1087e8;
  printf("Popcount 1 stats : %Lf - %Lf\n",lVar9 * lVar9,0xfffffff0 % (ulong)uVar10);
  *(longdouble *)(&stack0xfffffffffffffe78 + lVar5) = lVar19;
  *(longdouble *)((long)&lStack_198 + lVar5) = lVar22;
  *(undefined8 *)((long)&uStack_1a0 + lVar5) = 0x108809;
  printf("Popcount 0 stats : %Lf - %Lf\n");
  *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10884b;
  printf("MomentChi2 for bits 1 :  %8.6g \n");
  auVar29._8_8_ = 0;
  auVar29._0_8_ = (double)(((lVar23 - lVar14) * (lVar23 - lVar14)) / (lVar17 + lVar15));
  auVar4 = vmaxsd_avx(auVar29,ZEXT816(0) << 0x40);
  *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10889b;
  printf("MomentChi2 for bits 0 :  %8.6g \n");
  auVar26._8_8_ = 0;
  auVar26._0_8_ = (double)(((lVar22 - lVar14) * (lVar22 - lVar14)) / (lVar19 + lVar15));
  auVar1._8_8_ = 0;
  auVar1._0_8_ = auVar4._0_8_;
  auVar1 = vmaxsd_avx(auVar26,auVar1);
  *(undefined8 *)((long)&uStack_180 + lVar5) = 0x1088b6;
  puts("\nDerivative stats (transition from 2 consecutive values) : ");
  *(longdouble *)(&stack0xfffffffffffffe78 + lVar5) = lVar18;
  *(longdouble *)((long)&lStack_198 + lVar5) = lVar24;
  *(undefined8 *)((long)&uStack_1a0 + lVar5) = 0x1088d1;
  printf("Popcount 1 stats : %Lf - %Lf\n");
  *(longdouble *)(&stack0xfffffffffffffe78 + lVar5) = lVar16;
  *(longdouble *)((long)&lStack_198 + lVar5) = lVar20;
  *(undefined8 *)((long)&uStack_1a0 + lVar5) = 0x1088e8;
  printf("Popcount 0 stats : %Lf - %Lf\n");
  *(undefined8 *)((long)&uStack_180 + lVar5) = 0x108927;
  printf("MomentChi2 for deriv b1 :  %8.6g \n");
  auVar27._8_8_ = 0;
  auVar27._0_8_ = (double)(((lVar24 - lVar14) * (lVar24 - lVar14)) / (lVar15 + lVar18));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = auVar1._0_8_;
  auVar1 = vmaxsd_avx(auVar27,auVar4);
  *(undefined8 *)((long)&uStack_180 + lVar5) = 0x108971;
  printf("MomentChi2 for deriv b0 :  %8.6g \n");
  auVar28._8_8_ = 0;
  auVar28._0_8_ = (double)(((lVar20 - lVar14) * (lVar20 - lVar14)) / (lVar15 + lVar16));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = auVar1._0_8_;
  auVar1 = vmaxsd_avx(auVar28,auVar2);
  dVar25 = auVar1._0_8_;
  uVar12 = (uint)(dVar25 < 5.0) + (uint)(dVar25 < 50.0) + (uint)(dVar25 < 500.0);
  iVar6 = *(int *)(&DAT_0019db00 + (ulong)uVar12 * 4);
  *(undefined8 *)((long)&uStack_180 + lVar5) = 0x1089ce;
  printf("\n  %s \n\n",&DAT_0019db00 + iVar6);
  *(undefined8 *)((long)&uStack_180 + lVar5) = 0x1089d5;
  fflush((FILE *)0x0);
  return uVar12 != 0;
}

Assistant:

bool MomentChi2Test ( struct HashInfo *info, int inputSize)
{
  pfHash const hash = info->hash;
  const int step = ((g_speed > 500 || info->hashbits > 128)
                    && !g_testExtra) ? 6 : 3;
  unsigned s = 0;
  const unsigned mx = 0xfffffff0;
  assert(inputSize >= 4);
  long double n = mx/step;
  char key[inputSize]; memset(key, 0, sizeof(key));
#define HASH_SIZE_MAX 64
  int hbits = info->hashbits;
  assert(hbits <= HASH_SIZE_MAX*8);
  char hbuff[HASH_SIZE_MAX] = {0};

  assert(inputSize > 0);
  printf("Analyze hashes produced from a serie of linearly increasing numbers "
         "of %i-bit, using a step of %d ... \n", inputSize*8, step);
  fflush(NULL);

  /* Notes on the ranking system.
   * Ideally, this test should report and sum all popcount values
   * and compare the resulting distribution to an ideal distribution.
   *
   * What happens here is quite simplified :
   * the test gives "points" for each popcount, and sum them all.
   * The metric (using N^5) is heavily influenced by the largest outliers.
   * For example, a 64-bit hash should have a popcount close to 32.
   * But a popcount==40 will tilt the metric upward
   * more than popcount==24 will tilt the metric downward.
   * In reality, both situations should be ranked similarly.
   *
   * To compensate, we measure both popcount1 and popcount0,
   * and compare to some pre-calculated "optimal" sums for the hash size.
   *
   * Another limitation of this test is that it only popcounts the first 64-bit.
   * For large hashes, bits beyond this limit are ignored.
   */

  if (hbits > 64) hbits = 64;   // limited due to popcount8
  long double srefh, srefl;
  switch (hbits/8) {
      case 8:
          srefh = 38918200.;
          srefl = 410450.;
          break;
      case 4:
          srefh = 1391290.;
          srefl = 1030.9;
          break;
      default:
          printf("hash size not covered \n");
          abort();
  }
  printf("Target values to approximate : %Lf - %Lf \n", srefh, srefl);

  uint64_t previous = 0;
  long double b1h = 0. , b1l = 0., db1h = 0., db1l = 0.;
  long double b0h = 0. , b0l = 0., db0h = 0., db0l = 0.;
  for (unsigned i=1; i<=mx; i+=step) {
    assert(sizeof(i) <= inputSize);
    memcpy(key, &i, sizeof(i));
    hash(key, inputSize, s, hbuff);

    uint64_t h; memcpy(&h, hbuff, 8);
    // popcount8 assumed to work on 64-bit
    // note : ideally, one should rather popcount the whole hash
    {   uint64_t const bits1 = popcount8(h);
        uint64_t const bits0 = hbits - bits1;
        uint64_t const b1_exp5 = bits1 * bits1 * bits1 * bits1 * bits1;
        uint64_t const b0_exp5 = bits0 * bits0 * bits0 * bits0 * bits0;
        b1h+=b1_exp5; b1l+=b1_exp5*b1_exp5;
        b0h+=b0_exp5; b0l+=b0_exp5*b0_exp5;
    }
    // derivative
    {   uint64_t const bits1 = popcount8(previous^h);
        uint64_t const bits0 = hbits - bits1;
        uint64_t const b1_exp5 = bits1 * bits1 * bits1 * bits1 * bits1;
        uint64_t const b0_exp5 = bits0 * bits0 * bits0 * bits0 * bits0;
        db1h+=b1_exp5; db1l+=b1_exp5*b1_exp5;
        db0h+=b0_exp5; db0l+=b0_exp5*b0_exp5;
    }
    previous=h;
  }

  b1h/=n; b1l=(b1l/n-b1h*b1h)/n;
  db1h/=n; db1l=(db1l/n-db1h*db1h)/n;
  b0h/=n; b0l=(b0l/n-b0h*b0h)/n;
  db0h/=n; db0l=(db0l/n-db0h*db0h)/n;

  printf("Popcount 1 stats : %Lf - %Lf\n", b1h, b1l);
  printf("Popcount 0 stats : %Lf - %Lf\n", b0h, b0l);
  double worsec2 = 0;
  {   double chi2 = (b1h-srefh) * (b1h-srefh) / (b1l+srefl);
      printf("MomentChi2 for bits 1 :  %8.6g \n", chi2);
      if (chi2 > worsec2) worsec2 = chi2;
  }
  {   double chi2 = (b0h-srefh) * (b0h-srefh) / (b0l+srefl);
      printf("MomentChi2 for bits 0 :  %8.6g \n", chi2);
      if (chi2 > worsec2) worsec2 = chi2;
  }

  /* Derivative :
   * In this scenario, 2 consecutive hashes are xored,
   * and the outcome of this xor operation is then popcount controlled.
   * Obviously, the _order_ in which the hash values are generated becomes critical.
   *
   * This scenario comes from the prng world,
   * where derivative of the generated suite of random numbers is analyzed
   * to ensure the suite is truly "random".
   *
   * However, in almost all prng, the seed of next random number is the previous random number.
   *
   * This scenario is quite different: it introduces a fixed distance between 2 consecutive "seeds".
   * This is especially detrimental to algorithms relying on linear operations, such as multiplications.
   *
   * This scenario is relevant if the hash is used as a prng and generates values from a linearly increasing counter as a seed.
   * It is not relevant for scenarios employing the hash as a prng
   * with the more classical method of using the previous random number as a seed for the next one.
   * This scenario has no relevance for classical usages of hash algorithms,
   * such as hash tables, bloom filters and such, were only the raw values are ever used.
   */
  printf("\nDerivative stats (transition from 2 consecutive values) : \n");
  printf("Popcount 1 stats : %Lf - %Lf\n", db1h, db1l);
  printf("Popcount 0 stats : %Lf - %Lf\n", db0h, db0l);
  {   double chi2 = (db1h-srefh) * (db1h-srefh) / (db1l+srefl);
      printf("MomentChi2 for deriv b1 :  %8.6g \n", chi2);
      if (chi2 > worsec2) worsec2 = chi2;
  }
  {   double chi2 = (db0h-srefh) * (db0h-srefh) / (db0l+srefl);
      printf("MomentChi2 for deriv b0 :  %8.6g \n", chi2);
      if (chi2 > worsec2) worsec2 = chi2;
  }

  // note : previous threshold : 3.84145882069413
  int const rank = (worsec2 < 500.) + (worsec2 < 50.) + (worsec2 < 5.);
  assert(0 <= rank && rank <= 3);

  const char* rankstr[4] = { "FAIL !!!!", "pass", "Good !", "Great !!" };
  printf("\n  %s \n\n", rankstr[rank]);
  fflush(NULL);

  return (rank > 0);
}